

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCTestResourceSpec.cxx
# Opt level: O0

bool testSpec(string *path,ReadFileResult expectedResult,cmCTestResourceSpec *expected)

{
  bool bVar1;
  ReadFileResult result_00;
  ostream *poVar2;
  char *pcVar3;
  undefined1 local_58 [4];
  ReadFileResult result;
  cmCTestResourceSpec actual;
  cmCTestResourceSpec *expected_local;
  ReadFileResult expectedResult_local;
  string *path_local;
  
  actual.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)expected;
  cmCTestResourceSpec::cmCTestResourceSpec((cmCTestResourceSpec *)local_58);
  result_00 = cmCTestResourceSpec::ReadFromJSONFile((cmCTestResourceSpec *)local_58,path);
  if (result_00 == expectedResult) {
    bVar1 = cmCTestResourceSpec::operator!=
                      ((cmCTestResourceSpec *)local_58,
                       (cmCTestResourceSpec *)
                       actual.LocalSocket.Resources._M_t._M_impl.super__Rb_tree_header._M_node_count
                      );
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"ReadFromJSONFile(\"");
      poVar2 = std::operator<<(poVar2,(string *)path);
      poVar2 = std::operator<<(poVar2,"\") did not give expected spec");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      path_local._7_1_ = false;
    }
    else {
      path_local._7_1_ = true;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"ReadFromJSONFile(\"");
    poVar2 = std::operator<<(poVar2,(string *)path);
    poVar2 = std::operator<<(poVar2,"\") returned \"");
    pcVar3 = cmCTestResourceSpec::ResultToString(result_00);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"\", should be \"");
    pcVar3 = cmCTestResourceSpec::ResultToString(expectedResult);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    path_local._7_1_ = false;
  }
  cmCTestResourceSpec::~cmCTestResourceSpec((cmCTestResourceSpec *)local_58);
  return path_local._7_1_;
}

Assistant:

static bool testSpec(const std::string& path,
                     cmCTestResourceSpec::ReadFileResult expectedResult,
                     const cmCTestResourceSpec& expected)
{
  cmCTestResourceSpec actual;
  auto result = actual.ReadFromJSONFile(path);
  if (result != expectedResult) {
    std::cout << "ReadFromJSONFile(\"" << path << "\") returned \""
              << cmCTestResourceSpec::ResultToString(result)
              << "\", should be \""
              << cmCTestResourceSpec::ResultToString(expectedResult) << "\""
              << std::endl;
    return false;
  }

  if (actual != expected) {
    std::cout << "ReadFromJSONFile(\"" << path
              << "\") did not give expected spec" << std::endl;
    return false;
  }

  return true;
}